

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O0

void __thiscall gui::ColorPicker::draw(ColorPicker *this,RenderTarget *target,RenderStates states)

{
  bool bVar1;
  element_type *peVar2;
  const_reference pvVar3;
  Color *in_RSI;
  ContainerBase *in_RDI;
  float x;
  shared_ptr<gui::Widget> *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *__range1;
  Vector2f shadingRectangleSize;
  Color *in_stack_ffffffffffffff88;
  Transform *in_stack_ffffffffffffff90;
  Shape *this_00;
  ColorPicker *in_stack_ffffffffffffffa8;
  __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
  local_30;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *local_28;
  Color local_1c;
  Vector2f local_18;
  Color *local_10;
  
  local_10 = in_RSI;
  bVar1 = Widget::isVisible((Widget *)(in_RDI + 1));
  if (bVar1) {
    Widget::getTransform((Widget *)0x18d6c5);
    sf::operator*=(in_stack_ffffffffffffff90,(Transform *)in_stack_ffffffffffffff88);
    sf::RenderTarget::draw
              ((RenderTarget *)this,(Drawable *)target,(RenderStates *)shadingRectangleSize);
    local_18 = getShadingRectangleSize(in_stack_ffffffffffffffa8);
    peVar2 = std::
             __shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x18d712);
    this_00 = (Shape *)&(peVar2->dot_).super_Shape.super_Transformable;
    pvVar3 = std::array<float,_4UL>::operator[]
                       ((array<float,_4UL> *)this_00,(size_type)in_stack_ffffffffffffff88);
    x = *pvVar3 * local_18.x;
    pvVar3 = std::array<float,_4UL>::operator[]
                       ((array<float,_4UL> *)this_00,(size_type)in_stack_ffffffffffffff88);
    sf::Transformable::setPosition((Transformable *)this_00,x,(1.0 - *pvVar3) * local_18.y);
    std::__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x18d78e);
    sf::Color::Color(&local_1c,
                     *(Uint8 *)&in_RDI[0x18].children_.
                                super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                     *(Uint8 *)((long)&in_RDI[0x18].children_.
                                       super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1),
                     *(Uint8 *)((long)&in_RDI[0x18].children_.
                                       super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 2),0xff);
    sf::Shape::setFillColor(this_00,in_stack_ffffffffffffff88);
    std::__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::ColorPickerStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x18d7f2);
    sf::RenderTarget::draw
              ((RenderTarget *)this,(Drawable *)target,(RenderStates *)shadingRectangleSize);
    sf::RenderTarget::draw
              ((RenderTarget *)this,(Drawable *)target,(RenderStates *)shadingRectangleSize);
    sf::RenderTarget::draw
              ((RenderTarget *)this,(Drawable *)target,(RenderStates *)shadingRectangleSize);
    local_28 = ContainerBase::getChildren(in_RDI);
    local_30._M_current =
         (shared_ptr<gui::Widget> *)
         std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::
         begin((vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                *)in_stack_ffffffffffffff88);
    std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::end
              ((vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                *)in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)this_00,
                              (__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)in_stack_ffffffffffffff88), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator*(&local_30);
      in_stack_ffffffffffffff88 = local_10;
      std::__shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 this_00);
      sf::RenderTarget::draw
                ((RenderTarget *)this,(Drawable *)target,(RenderStates *)shadingRectangleSize);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void ColorPicker::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    target.draw(shadingRectangle_, states);
    const sf::Vector2f shadingRectangleSize = getShadingRectangleSize();
    style_->dot_.setPosition(currentColorHsva_[1] * shadingRectangleSize.x, (1.0f - currentColorHsva_[2]) * shadingRectangleSize.y);
    style_->dot_.setFillColor({roundedColorRgba_.r, roundedColorRgba_.g, roundedColorRgba_.b, 255});
    target.draw(style_->dot_, states);

    target.draw(hueBar_, states);
    states.texture = &alphaTexture_;
    target.draw(alphaBar_, states);
    states.texture = nullptr;

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}